

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O1

Var Js::JavascriptFunction::CallSpreadFunction
              (RecyclableObject *function,Arguments *args,AuxArray<unsigned_int> *spreadIndices)

{
  ScriptContext *scriptContext;
  long lVar1;
  size_t __n;
  uint count;
  uint uVar2;
  JavascriptMethod entryPoint;
  Var pvVar3;
  ScriptContext *scriptContext_00;
  Type __s;
  Type TVar4;
  ulong uVar5;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  Var stackArgs [8];
  Arguments local_80;
  Arguments local_70;
  Arguments local_60;
  AuxArray<unsigned_int> *local_50;
  size_t local_48;
  undefined1 local_40 [8];
  Arguments outArgs;
  
  __s = (Type)&uStack_c8;
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_80.Info = args->Info;
  local_80.Values = args->Values;
  uStack_d0 = 0xbd685b;
  count = GetSpreadSize(&local_80,spreadIndices,scriptContext);
  uStack_d0 = 0xbd686a;
  uVar2 = CallInfo::GetLargeArgCountWithExtraArgs((uint)(byte)(args->Info).field_0x3,count);
  scriptContext_00 = (ScriptContext *)((ulong)(byte)(args->Info).field_0x3 << 0x18);
  TVar4._0_4_ = count & 0xffffff | (uint)scriptContext_00;
  TVar4._4_4_ = 0;
  outArgs.Info = (Type)0x0;
  local_40 = (undefined1  [8])TVar4;
  if (uVar2 < 9) {
    outArgs.Info = (Type)&uStack_c8;
    uStack_c8 = 0;
    stackArgs[0] = (Var)0x0;
    stackArgs[1] = (Var)0x0;
    stackArgs[2] = (Var)0x0;
    stackArgs[3] = (Var)0x0;
    stackArgs[4] = (Var)0x0;
    stackArgs[5] = (Var)0x0;
    stackArgs[6] = (Var)0x0;
  }
  else {
    uVar5 = (ulong)uVar2;
    local_48 = uVar5 * 8;
    scriptContext_00 = (ScriptContext *)0x0;
    uStack_d0 = 0xbd68b9;
    local_50 = spreadIndices;
    ThreadContext::ProbeStack
              (scriptContext->threadContext,uVar5 * 8 + 0xc00,scriptContext,(PVOID)0x0);
    __n = local_48;
    spreadIndices = local_50;
    lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
    __s = (Type)((long)stackArgs + lVar1 + -8);
    outArgs.Info = __s;
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0xbd68e1;
    memset((void *)__s,0,__n);
  }
  local_70.Info = args->Info;
  local_70.Values = args->Values;
  *(undefined8 *)((long)__s + -8) = 0xbd6921;
  SpreadArgs(&local_70,(Arguments *)local_40,spreadIndices,scriptContext_00);
  *(undefined8 *)((long)__s + -8) = 0xbd6929;
  entryPoint = RecyclableObject::GetEntryPoint(function);
  local_60.Values = (Type)outArgs.Info;
  local_60.Info = TVar4;
  *(undefined8 *)((long)__s + -8) = 0xbd6948;
  pvVar3 = CallFunction<true>(function,entryPoint,&local_60,true);
  return pvVar3;
}

Assistant:

Var JavascriptFunction::CallSpreadFunction(RecyclableObject* function, Arguments args, const Js::AuxArray<uint32> *spreadIndices)
    {
        ScriptContext* scriptContext = function->GetScriptContext();

        // Work out the expanded number of arguments.
        uint spreadSize = GetSpreadSize(args, spreadIndices, scriptContext);
        uint32 actualLength = CallInfo::GetLargeArgCountWithExtraArgs(args.Info.Flags, spreadSize);

        // Allocate (if needed) space for the expanded arguments.
        Arguments outArgs(CallInfo(args.Info.Flags, spreadSize), nullptr);
        Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
        size_t outArgsSize = 0;
        if (actualLength > STACK_ARGS_ALLOCA_THRESHOLD)
        {
            PROBE_STACK(scriptContext, actualLength * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
            outArgsSize = actualLength * sizeof(Var);
            outArgs.Values = (Var*)_alloca(outArgsSize);
            ZeroMemory(outArgs.Values, outArgsSize);
        }
        else
        {
            outArgs.Values = stackArgs;
            outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
            ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
        }

        SpreadArgs(args, outArgs, spreadIndices, scriptContext);

        // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the large argcount logic in this case.
        return JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), outArgs, true);
    }